

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

QueryCounters * __thiscall
DatabaseSnapshot::execute
          (QueryCounters *__return_storage_ptr__,DatabaseSnapshot *this,Query *query,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *datasets,Task *task,ResultWriter *out)

{
  size_type __n;
  OnDiskDataset *this_00;
  pointer ppOVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  runtime_error *this_01;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  iterator __end1;
  iterator __begin1;
  pointer ppOVar4;
  OnDiskDataset *dsptr;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_58;
  Query *local_40;
  OnDiskDataset *local_38;
  
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (datasets->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_40 = query;
  if (__n == 0) {
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::operator=
              (&local_58,&this->datasets);
  }
  else {
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::reserve
              (&local_58,__n);
    for (p_Var3 = (datasets->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(datasets->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_38 = find_dataset(this,(string *)(p_Var3 + 1));
      if (local_38 == (OnDiskDataset *)0x0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid dataset specified in query");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
      emplace_back<OnDiskDataset_const*&>
                ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)&local_58,
                 &local_38);
    }
  }
  ppOVar1 = local_58.
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  LOCK();
  *(long *)(*(long *)task + 0x50) =
       (long)local_58.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_58.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  UNLOCK();
  (__return_storage_ptr__->ands_).count_ = 0;
  (__return_storage_ptr__->ands_).duration_.__r = 0;
  (__return_storage_ptr__->ors_).count_ = 0;
  (__return_storage_ptr__->ors_).duration_.__r = 0;
  (__return_storage_ptr__->reads_).count_ = 0;
  (__return_storage_ptr__->reads_).duration_.__r = 0;
  (__return_storage_ptr__->uniq_reads_).count_ = 0;
  (__return_storage_ptr__->uniq_reads_).duration_.__r = 0;
  (__return_storage_ptr__->minofs_).count_ = 0;
  (__return_storage_ptr__->minofs_).duration_.__r = 0;
  for (ppOVar4 = local_58.
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppOVar1 != ppOVar4; ppOVar4 = ppOVar4 + 1
      ) {
    this_00 = *ppOVar4;
    LOCK();
    *(long *)(*(long *)task + 0x58) = *(long *)(*(long *)task + 0x58) + 1;
    UNLOCK();
    bVar2 = OnDiskDataset::has_all_taints(this_00,taints);
    if (bVar2) {
      OnDiskDataset::execute(this_00,local_40,out,__return_storage_ptr__);
    }
  }
  if (local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

QueryCounters DatabaseSnapshot::execute(const Query &query,
                                        const std::set<std::string> &taints,
                                        const std::set<std::string> &datasets,
                                        Task *task, ResultWriter *out) const {
    std::vector<const OnDiskDataset *> datasets_to_query;
    if (datasets.empty()) {
        // No datasets selected explicitly == query everything.
        datasets_to_query = get_datasets();
    } else {
        datasets_to_query.reserve(datasets.size());
        for (const auto &dsname : datasets) {
            const auto *dsptr = find_dataset(dsname);
            if (dsptr == nullptr) {
                throw std::runtime_error("Invalid dataset specified in query");
            }
            datasets_to_query.emplace_back(dsptr);
        }
    }

    task->spec().estimate_work(datasets_to_query.size());

    QueryCounters counters;
    for (const auto *ds : datasets_to_query) {
        task->spec().add_progress(1);
        if (!ds->has_all_taints(taints)) {
            continue;
        }
        ds->execute(query, out, &counters);
    }
    return counters;
}